

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::MakeEndGroupMismatchError
          (json_internal *this,int field_number,int current_group)

{
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355>
  local_58;
  string local_48;
  undefined1 local_28 [16];
  int local_18;
  int local_14;
  int current_group_local;
  int field_number_local;
  
  local_18 = current_group;
  local_14 = field_number;
  _current_group_local = this;
  absl::lts_20240722::str_format_internal::
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355>
  ::FormatSpecTemplate(&local_58,"attempted to close group %d while inside group %d");
  absl::lts_20240722::StrFormat<int,_int>(&local_48,&local_58,&local_14,&local_18);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  absl::lts_20240722::InvalidArgumentError(this,local_28._0_8_,local_28._8_8_);
  std::__cxx11::string::~string((string *)&local_48);
  return (Status)(uintptr_t)this;
}

Assistant:

PROTOBUF_NOINLINE static absl::Status MakeEndGroupMismatchError(
    int field_number, int current_group) {
  return absl::InvalidArgumentError(
      absl::StrFormat("attempted to close group %d while inside group %d",
                      field_number, current_group));
}